

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::Interpreter::instantiate
          (Result<wasm::Ok> *__return_storage_ptr__,Interpreter *this,Instance *instance)

{
  bool bVar1;
  element_type *peVar2;
  pointer pGVar3;
  size_type sVar4;
  reference other;
  mapped_type *this_00;
  Ok local_81;
  undefined1 local_80 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> results;
  ExpressionIterator local_58;
  reference local_40;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range1;
  Instance *instance_local;
  Interpreter *this_local;
  
  peVar2 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )instance);
  __end1 = std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::begin(&peVar2->globals);
  global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
           std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::end(&peVar2->globals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                *)&global);
    if (!bVar1) {
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_81);
      return __return_storage_ptr__;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
               ::operator*(&__end1);
    pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(local_40)
    ;
    interpreter::ExpressionIterator::ExpressionIterator(&local_58,pGVar3->init);
    std::vector<wasm::interpreter::Frame,std::allocator<wasm::interpreter::Frame>>::
    emplace_back<wasm::interpreter::Instance&,wasm::interpreter::ExpressionIterator>
              ((vector<wasm::interpreter::Frame,std::allocator<wasm::interpreter::Frame>> *)this,
               instance,&local_58);
    interpreter::ExpressionIterator::~ExpressionIterator(&local_58);
    run((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_80,this);
    sVar4 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::size
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_80);
    if (sVar4 != 1) break;
    other = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator[]
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_80,0);
    pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(local_40)
    ;
    this_00 = std::
              unordered_map<wasm::Name,_wasm::Literal,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literal>_>_>
              ::operator[](&instance->globalValues,(key_type *)pGVar3);
    wasm::Literal::operator=(this_00,other);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_80);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("results.size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/interpreter/interpreter.cpp"
                ,0x124,"Result<> wasm::Interpreter::instantiate(Instance &)");
}

Assistant:

Result<> Interpreter::instantiate(Instance& instance) {
  for (auto& global : instance.wasm->globals) {
    store.callStack.emplace_back(instance, ExpressionIterator(global->init));
    auto results = run();
    assert(results.size() == 1);
    instance.globalValues[global->name] = results[0];
  }
  return Ok{};
}